

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  undefined8 *puVar1;
  int iVar2;
  pointer pBVar3;
  int *piVar4;
  void *pvVar5;
  Allocator *pAVar6;
  pointer pMVar7;
  long *plVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Layer *pLVar12;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  Layer *pLVar13;
  undefined4 extraout_var_10;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int *piVar18;
  long lVar19;
  int typeindex;
  int top_count;
  int bottom_count;
  int blob_count;
  int layer_count;
  ParamDict pd;
  int magic;
  int bottom_blob_index;
  Option opt1;
  uint local_148;
  int local_144;
  char local_13d;
  int local_13c;
  Net *local_138;
  int local_130;
  int local_12c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_128;
  Layer *local_120;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_118;
  vector<int,_std::allocator<int>_> *local_110;
  vector<int,_std::allocator<int>_> *local_108;
  ParamDict local_100;
  int local_ec;
  Mat local_e8;
  undefined1 local_98 [32];
  Allocator *local_78;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  int iStack_60;
  size_t local_58;
  Option *local_48;
  DataReader *local_40;
  Net *local_38;
  
  local_ec = 0;
  iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_ec,4);
  if (CONCAT44(extraout_var,iVar11) != 4) {
    load_param_bin();
    return -1;
  }
  if (local_ec != 0x7685dd) {
    load_param_bin();
    return -1;
  }
  local_12c = 0;
  local_130 = 0;
  iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_12c,4);
  if (CONCAT44(extraout_var_00,iVar11) != 4) {
    load_param_bin();
    return -1;
  }
  iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_130,4);
  if (CONCAT44(extraout_var_01,iVar11) != 4) {
    load_param_bin();
    return -1;
  }
  if (((long)local_12c < 1) || (local_130 < 1)) {
    load_param_bin();
    return -1;
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
            (&this->d->layers,(long)local_12c);
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(&this->d->blobs,(long)local_130);
  ParamDict::ParamDict(&local_100);
  if (0 < local_12c) {
    local_48 = &this->opt;
    local_138 = (Net *)0x0;
    local_40 = dr;
    local_38 = this;
    do {
      iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_148,4);
      if (CONCAT44(extraout_var_02,iVar11) == 4) {
        iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_13c,4);
        if (CONCAT44(extraout_var_03,iVar11) != 4) {
          load_param_bin();
          goto LAB_0013c8df;
        }
        iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_144,4);
        if (CONCAT44(extraout_var_04,iVar11) != 4) {
          load_param_bin();
          goto LAB_0013c8df;
        }
        iVar11 = (*this->_vptr_Net[6])(this,(ulong)local_148);
        pLVar12 = (Layer *)CONCAT44(extraout_var_05,iVar11);
        if (pLVar12 == (Layer *)0x0) {
          pLVar12 = create_layer_cpu(local_148);
        }
        if (pLVar12 == (Layer *)0x0) {
          iVar11 = (*this->_vptr_Net[5])(this,(ulong)(local_148 & 0xfffffeff));
          pLVar12 = (Layer *)CONCAT44(extraout_var_06,iVar11);
        }
        if (pLVar12 == (Layer *)0x0) {
          fprintf(_stderr,"layer %d not exists or registered",(ulong)local_148);
          fputc(10,_stderr);
          iVar11 = 1;
          clear(this);
        }
        else {
          local_108 = &pLVar12->bottoms;
          std::vector<int,_std::allocator<int>_>::resize(local_108,(long)local_13c);
          bVar9 = 0 < local_13c;
          iVar11 = 0x17;
          if (0 < local_13c) {
            lVar15 = 0;
            do {
              iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_e8,4);
              if (CONCAT44(extraout_var_07,iVar11) != 4) {
                load_param_bin();
                iVar11 = 1;
                goto LAB_0013c779;
              }
              (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
              super__Vector_impl_data._M_start[(int)local_e8.data].consumer = (int)local_138;
              (local_108->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar15] = (int)local_e8.data;
              lVar15 = lVar15 + 1;
              bVar9 = lVar15 < local_13c;
            } while (lVar15 < local_13c);
            iVar11 = 0x17;
          }
LAB_0013c779:
          if (!bVar9) {
            local_110 = &pLVar12->tops;
            std::vector<int,_std::allocator<int>_>::resize(local_110,(long)local_144);
            bVar9 = 0 < local_144;
            iVar11 = 0x1c;
            if (0 < local_144) {
              lVar15 = 0;
              do {
                iVar11 = (*dr->_vptr_DataReader[3])(dr,&local_e8,4);
                if (CONCAT44(extraout_var_08,iVar11) != 4) {
                  load_param_bin();
                  iVar11 = 1;
                  goto LAB_0013c823;
                }
                (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                .super__Vector_impl_data._M_start[(int)local_e8.data].producer = (int)local_138;
                (local_110->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar15] = (int)local_e8.data;
                lVar15 = lVar15 + 1;
                bVar9 = lVar15 < local_144;
              } while (lVar15 < local_144);
              iVar11 = 0x1c;
            }
LAB_0013c823:
            if (!bVar9) {
              bVar9 = pLVar12->support_vulkan;
              iVar11 = ParamDict::load_param_bin(&local_100,dr);
              if (iVar11 == 0) {
                local_58 = 0;
                local_98._0_8_ = (void *)0x0;
                local_98._8_4_ = 0;
                local_98._12_4_ = 0;
                local_98._16_4_ = 0;
                local_98._20_8_ = 0;
                iStack_68 = 0;
                iStack_64 = 0;
                iStack_60 = 0;
                local_78 = (Allocator *)0x0;
                iStack_70 = 0;
                iStack_6c = 0;
                local_120 = pLVar12;
                ParamDict::get(&local_e8,&local_100,0x1e,(Mat *)local_98);
                piVar18 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
                if (piVar18 != (int *)0x0) {
                  LOCK();
                  *piVar18 = *piVar18 + -1;
                  UNLOCK();
                  if (*piVar18 == 0) {
                    if (local_78 == (Allocator *)0x0) {
                      if ((void *)local_98._0_8_ != (void *)0x0) {
                        free((void *)local_98._0_8_);
                      }
                    }
                    else {
                      (*local_78->_vptr_Allocator[3])();
                    }
                  }
                }
                local_58 = 0;
                local_98._0_8_ = (void *)0x0;
                local_98._8_4_ = 0;
                local_98._12_4_ = 0;
                local_98._16_4_ = 0;
                local_98._20_8_ = 0;
                iStack_70 = 0;
                iStack_6c = 0;
                iStack_68 = 0;
                iStack_64 = 0;
                iStack_60 = 0;
                local_13d = bVar9;
                if (((local_e8.data != (void *)0x0) && ((long)local_e8.c * local_e8.cstep != 0)) &&
                   (0 < local_144)) {
                  piVar18 = (int *)((long)local_e8.data + 0xc);
                  lVar15 = 0;
                  do {
                    iVar11 = (local_110->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar15];
                    pBVar3 = (this->d->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    iVar16 = piVar18[-3];
                    if (iVar16 == 3) {
                      iVar16 = piVar18[-2];
                      iVar2 = piVar18[-1];
                      iVar17 = *piVar18;
                      piVar4 = pBVar3[iVar11].shape.refcount;
                      if (piVar4 != (int *)0x0) {
                        LOCK();
                        *piVar4 = *piVar4 + -1;
                        UNLOCK();
                        if (*piVar4 == 0) {
                          pvVar5 = pBVar3[iVar11].shape.data;
                          pAVar6 = pBVar3[iVar11].shape.allocator;
                          if (pAVar6 == (Allocator *)0x0) {
                            if (pvVar5 != (void *)0x0) {
                              local_128 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                          CONCAT44(local_128._4_4_,iVar17);
                              free(pvVar5);
                              iVar17 = (int)local_128;
                            }
                          }
                          else {
                            local_128 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                        CONCAT44(local_128._4_4_,iVar17);
                            (*pAVar6->_vptr_Allocator[3])();
                            iVar17 = (int)local_128;
                          }
                        }
                      }
                      pBVar3[iVar11].shape.cstep = 0;
                      *(undefined8 *)((long)&pBVar3[iVar11].shape.refcount + 4) = 0;
                      *(undefined8 *)((long)&pBVar3[iVar11].shape.elemsize + 4) = 0;
                      pBVar3[iVar11].shape.data = (void *)0x0;
                      pBVar3[iVar11].shape.refcount = (int *)0x0;
                      pBVar3[iVar11].shape.dims = 0;
                      pBVar3[iVar11].shape.w = 0;
                      pBVar3[iVar11].shape.h = 0;
                      pBVar3[iVar11].shape.d = 0;
                      pBVar3[iVar11].shape.elemsize = 4;
                      pBVar3[iVar11].shape.elempack = 1;
                      pBVar3[iVar11].shape.allocator = (Allocator *)0x0;
                      pBVar3[iVar11].shape.dims = 3;
                      pBVar3[iVar11].shape.w = iVar16;
                      pBVar3[iVar11].shape.h = iVar2;
                      pBVar3[iVar11].shape.d = 1;
                      pBVar3[iVar11].shape.c = iVar17;
                      pBVar3[iVar11].shape.cstep =
                           (long)iVar2 * (long)iVar16 + 3U & 0x3ffffffffffffffc;
                    }
                    else if (iVar16 == 2) {
                      iVar16 = piVar18[-2];
                      iVar2 = piVar18[-1];
                      piVar4 = pBVar3[iVar11].shape.refcount;
                      if (piVar4 != (int *)0x0) {
                        LOCK();
                        *piVar4 = *piVar4 + -1;
                        UNLOCK();
                        if (*piVar4 == 0) {
                          pvVar5 = pBVar3[iVar11].shape.data;
                          pAVar6 = pBVar3[iVar11].shape.allocator;
                          if (pAVar6 == (Allocator *)0x0) {
                            if (pvVar5 != (void *)0x0) {
                              free(pvVar5);
                            }
                          }
                          else {
                            (*pAVar6->_vptr_Allocator[3])();
                          }
                        }
                      }
                      pBVar3[iVar11].shape.cstep = 0;
                      *(undefined8 *)((long)&pBVar3[iVar11].shape.refcount + 4) = 0;
                      *(undefined8 *)((long)&pBVar3[iVar11].shape.elemsize + 4) = 0;
                      pBVar3[iVar11].shape.data = (void *)0x0;
                      pBVar3[iVar11].shape.refcount = (int *)0x0;
                      pBVar3[iVar11].shape.dims = 0;
                      pBVar3[iVar11].shape.w = 0;
                      pBVar3[iVar11].shape.h = 0;
                      pBVar3[iVar11].shape.d = 0;
                      pBVar3[iVar11].shape.elemsize = 4;
                      pBVar3[iVar11].shape.elempack = 1;
                      pBVar3[iVar11].shape.allocator = (Allocator *)0x0;
                      pBVar3[iVar11].shape.dims = 2;
                      pBVar3[iVar11].shape.w = iVar16;
                      pBVar3[iVar11].shape.h = iVar2;
                      pBVar3[iVar11].shape.d = 1;
                      pBVar3[iVar11].shape.c = 1;
                      pBVar3[iVar11].shape.cstep = (long)iVar2 * (long)iVar16;
                      this = local_38;
                    }
                    else if (iVar16 == 1) {
                      iVar16 = piVar18[-2];
                      piVar4 = pBVar3[iVar11].shape.refcount;
                      if (piVar4 != (int *)0x0) {
                        LOCK();
                        *piVar4 = *piVar4 + -1;
                        UNLOCK();
                        if (*piVar4 == 0) {
                          pvVar5 = pBVar3[iVar11].shape.data;
                          pAVar6 = pBVar3[iVar11].shape.allocator;
                          if (pAVar6 == (Allocator *)0x0) {
                            if (pvVar5 != (void *)0x0) {
                              free(pvVar5);
                            }
                          }
                          else {
                            (*pAVar6->_vptr_Allocator[3])();
                          }
                        }
                      }
                      pBVar3[iVar11].shape.cstep = 0;
                      *(undefined8 *)((long)&pBVar3[iVar11].shape.refcount + 4) = 0;
                      *(undefined8 *)((long)&pBVar3[iVar11].shape.elemsize + 4) = 0;
                      pBVar3[iVar11].shape.data = (void *)0x0;
                      pBVar3[iVar11].shape.refcount = (int *)0x0;
                      pBVar3[iVar11].shape.dims = 0;
                      pBVar3[iVar11].shape.w = 0;
                      pBVar3[iVar11].shape.h = 0;
                      pBVar3[iVar11].shape.d = 0;
                      pBVar3[iVar11].shape.elemsize = 4;
                      pBVar3[iVar11].shape.elempack = 1;
                      pBVar3[iVar11].shape.allocator = (Allocator *)0x0;
                      pBVar3[iVar11].shape.dims = 1;
                      pBVar3[iVar11].shape.w = iVar16;
                      pBVar3[iVar11].shape.h = 1;
                      pBVar3[iVar11].shape.d = 1;
                      pBVar3[iVar11].shape.c = 1;
                      pBVar3[iVar11].shape.cstep = (long)iVar16;
                    }
                    lVar15 = lVar15 + 1;
                    piVar18 = piVar18 + 4;
                  } while (lVar15 < local_144);
                }
                local_118 = &local_120->bottom_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          (local_118,(long)local_13c);
                if (0 < local_13c) {
                  lVar19 = 0;
                  lVar15 = 0;
                  pvVar14 = local_118;
                  do {
                    iVar11 = (local_108->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar15];
                    pBVar3 = (this->d->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    pMVar7 = (pvVar14->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    puVar1 = (undefined8 *)((long)&pMVar7->data + lVar19);
                    if ((Mat *)puVar1 != &pBVar3[iVar11].shape) {
                      piVar18 = pBVar3[iVar11].shape.refcount;
                      if (piVar18 != (int *)0x0) {
                        LOCK();
                        *piVar18 = *piVar18 + 1;
                        UNLOCK();
                      }
                      piVar18 = *(int **)((long)&pMVar7->refcount + lVar19);
                      if (piVar18 != (int *)0x0) {
                        LOCK();
                        *piVar18 = *piVar18 + -1;
                        UNLOCK();
                        if (*piVar18 == 0) {
                          pvVar5 = *(void **)((long)&pMVar7->data + lVar19);
                          plVar8 = *(long **)((long)&pMVar7->allocator + lVar19);
                          if (plVar8 == (long *)0x0) {
                            if (pvVar5 != (void *)0x0) {
                              free(pvVar5);
                              pvVar14 = local_118;
                            }
                          }
                          else {
                            (**(code **)(*plVar8 + 0x18))();
                            pvVar14 = local_118;
                          }
                        }
                      }
                      *(undefined8 *)((long)&pMVar7->cstep + lVar19) = 0;
                      *(undefined8 *)((long)puVar1 + 0xc) = 0;
                      *(undefined8 *)((long)puVar1 + 0x14) = 0;
                      *puVar1 = 0;
                      puVar1[1] = 0;
                      puVar1 = (undefined8 *)((long)&pMVar7->dims + lVar19);
                      *puVar1 = 0;
                      puVar1[1] = 0;
                      *(undefined4 *)((long)&pMVar7->c + lVar19) = 0;
                      piVar18 = pBVar3[iVar11].shape.refcount;
                      puVar1 = (undefined8 *)((long)&pMVar7->data + lVar19);
                      *puVar1 = pBVar3[iVar11].shape.data;
                      puVar1[1] = piVar18;
                      *(size_t *)((long)&pMVar7->elemsize + lVar19) = pBVar3[iVar11].shape.elemsize;
                      *(int *)((long)&pMVar7->elempack + lVar19) = pBVar3[iVar11].shape.elempack;
                      *(Allocator **)((long)&pMVar7->allocator + lVar19) =
                           pBVar3[iVar11].shape.allocator;
                      iVar16 = pBVar3[iVar11].shape.w;
                      iVar2 = pBVar3[iVar11].shape.h;
                      iVar17 = pBVar3[iVar11].shape.d;
                      piVar18 = (int *)((long)&pMVar7->dims + lVar19);
                      *piVar18 = pBVar3[iVar11].shape.dims;
                      piVar18[1] = iVar16;
                      piVar18[2] = iVar2;
                      piVar18[3] = iVar17;
                      *(int *)((long)&pMVar7->c + lVar19) = pBVar3[iVar11].shape.c;
                      *(size_t *)((long)&pMVar7->cstep + lVar19) = pBVar3[iVar11].shape.cstep;
                    }
                    lVar15 = lVar15 + 1;
                    lVar19 = lVar19 + 0x48;
                  } while (lVar15 < local_13c);
                }
                local_128 = &local_120->top_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          (local_128,(long)local_144);
                if (0 < local_144) {
                  lVar19 = 0;
                  lVar15 = 0;
                  do {
                    iVar11 = (local_110->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar15];
                    pBVar3 = (this->d->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    pMVar7 = (local_128->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    puVar1 = (undefined8 *)((long)&pMVar7->data + lVar19);
                    if ((Mat *)puVar1 != &pBVar3[iVar11].shape) {
                      piVar18 = pBVar3[iVar11].shape.refcount;
                      if (piVar18 != (int *)0x0) {
                        LOCK();
                        *piVar18 = *piVar18 + 1;
                        UNLOCK();
                      }
                      piVar18 = *(int **)((long)&pMVar7->refcount + lVar19);
                      if (piVar18 != (int *)0x0) {
                        LOCK();
                        *piVar18 = *piVar18 + -1;
                        UNLOCK();
                        if (*piVar18 == 0) {
                          pvVar5 = *(void **)((long)&pMVar7->data + lVar19);
                          plVar8 = *(long **)((long)&pMVar7->allocator + lVar19);
                          if (plVar8 == (long *)0x0) {
                            if (pvVar5 != (void *)0x0) {
                              free(pvVar5);
                            }
                          }
                          else {
                            (**(code **)(*plVar8 + 0x18))();
                          }
                        }
                      }
                      *(undefined8 *)((long)&pMVar7->cstep + lVar19) = 0;
                      *(undefined8 *)((long)puVar1 + 0xc) = 0;
                      *(undefined8 *)((long)puVar1 + 0x14) = 0;
                      *puVar1 = 0;
                      puVar1[1] = 0;
                      puVar1 = (undefined8 *)((long)&pMVar7->dims + lVar19);
                      *puVar1 = 0;
                      puVar1[1] = 0;
                      *(undefined4 *)((long)&pMVar7->c + lVar19) = 0;
                      piVar18 = pBVar3[iVar11].shape.refcount;
                      puVar1 = (undefined8 *)((long)&pMVar7->data + lVar19);
                      *puVar1 = pBVar3[iVar11].shape.data;
                      puVar1[1] = piVar18;
                      *(size_t *)((long)&pMVar7->elemsize + lVar19) = pBVar3[iVar11].shape.elemsize;
                      *(int *)((long)&pMVar7->elempack + lVar19) = pBVar3[iVar11].shape.elempack;
                      *(Allocator **)((long)&pMVar7->allocator + lVar19) =
                           pBVar3[iVar11].shape.allocator;
                      iVar16 = pBVar3[iVar11].shape.w;
                      iVar2 = pBVar3[iVar11].shape.h;
                      iVar17 = pBVar3[iVar11].shape.d;
                      piVar18 = (int *)((long)&pMVar7->dims + lVar19);
                      *piVar18 = pBVar3[iVar11].shape.dims;
                      piVar18[1] = iVar16;
                      piVar18[2] = iVar2;
                      piVar18[3] = iVar17;
                      *(int *)((long)&pMVar7->c + lVar19) = pBVar3[iVar11].shape.c;
                      *(size_t *)((long)&pMVar7->cstep + lVar19) = pBVar3[iVar11].shape.cstep;
                    }
                    lVar15 = lVar15 + 1;
                    lVar19 = lVar19 + 0x48;
                  } while (lVar15 < local_144);
                }
                iVar11 = ParamDict::get(&local_100,0x1f,0);
                pLVar12 = local_120;
                local_120->featmask = iVar11;
                iVar11 = (*local_120->_vptr_Layer[2])(local_120,&local_100);
                dr = local_40;
                cVar10 = local_13d;
                if (iVar11 == 0) {
                  if (pLVar12->support_int8_storage == true) {
                    (this->opt).use_vulkan_compute = false;
                  }
                  get_masked_option((Option *)local_98,local_48,pLVar12->featmask);
                  if ((cVar10 != '\0') &&
                     ((pLVar12->support_vulkan != true || (local_98[0x1f] == false)))) {
                    iVar11 = (*this->_vptr_Net[6])(this,(ulong)local_148);
                    pLVar13 = (Layer *)CONCAT44(extraout_var_09,iVar11);
                    if (pLVar13 == (Layer *)0x0) {
                      pLVar13 = create_layer_cpu(local_148);
                    }
                    if (pLVar13 == (Layer *)0x0) {
                      iVar11 = (*this->_vptr_Net[5])(this,(ulong)(local_148 & 0xfffffeff));
                      pLVar13 = (Layer *)CONCAT44(extraout_var_10,iVar11);
                    }
                    if (pLVar13 == (Layer *)0x0) {
                      bVar9 = false;
                      fprintf(_stderr,"layer %d not exists or registered",(ulong)local_148);
                      pLVar12 = local_120;
                      fputc(10,_stderr);
                      iVar11 = 1;
                      clear(this);
                    }
                    else {
                      std::vector<int,_std::allocator<int>_>::operator=(&pLVar13->bottoms,local_108)
                      ;
                      std::vector<int,_std::allocator<int>_>::operator=(&pLVar13->tops,local_110);
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                                (&pLVar13->bottom_shapes,local_118);
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                                (&pLVar13->top_shapes,local_128);
                      pLVar13->featmask = pLVar12->featmask;
                      iVar11 = (*pLVar13->_vptr_Layer[2])(pLVar13,&local_100);
                      if (iVar11 == 0) {
                        (*pLVar12->_vptr_Layer[1])(pLVar12);
                        iVar11 = 0;
                        bVar9 = true;
                        pLVar12 = pLVar13;
                      }
                      else {
                        load_param_bin(local_138);
                        iVar11 = 0xe;
                        bVar9 = false;
                      }
                    }
                    if (!bVar9) goto LAB_0013cf49;
                  }
                  (this->d->layers).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)local_138] = pLVar12;
                  iVar11 = 0;
                }
                else {
                  load_param_bin(local_138);
                  iVar11 = 0xe;
                }
LAB_0013cf49:
                piVar18 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
                if (piVar18 != (int *)0x0) {
                  LOCK();
                  *piVar18 = *piVar18 + -1;
                  UNLOCK();
                  if (*piVar18 == 0) {
                    if (local_e8.allocator == (Allocator *)0x0) {
                      if (local_e8.data != (void *)0x0) {
                        free(local_e8.data);
                      }
                    }
                    else {
                      (*(local_e8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                local_e8.cstep = 0;
                local_e8.data = (void *)0x0;
                local_e8.refcount._0_4_ = 0;
                local_e8.refcount._4_4_ = 0;
                local_e8.elemsize._0_4_ = 0;
                local_e8._20_8_ = 0;
                local_e8.dims = 0;
                local_e8.w = 0;
                local_e8.h = 0;
                local_e8.d = 0;
                local_e8.c = 0;
              }
              else {
                load_param_bin(local_138);
                iVar11 = 0xe;
              }
            }
          }
        }
      }
      else {
        load_param_bin();
LAB_0013c8df:
        iVar11 = 1;
      }
      if ((iVar11 != 0xe) && (iVar11 != 0)) goto LAB_0013d055;
      local_138 = (Net *)((long)&local_138->_vptr_Net + 1);
    } while ((long)local_138 < (long)local_12c);
    iVar11 = 0xc;
LAB_0013d055:
    iVar16 = -1;
    if (iVar11 != 0xc) goto LAB_0013d06a;
  }
  iVar16 = 0;
  NetPrivate::update_input_output_indexes(this->d);
LAB_0013d06a:
  ParamDict::~ParamDict(&local_100);
  return iVar16;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#if __BIG_ENDIAN__
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }                                              \
    if (sizeof(buf) == 2)                          \
        swap_endianness_16(&buf);                  \
    if (sizeof(buf) == 4)                          \
        swap_endianness_32(&buf);
#else
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }
#endif

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize(layer_count);
    d->blobs.resize(blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev)
        {
            int device_index = opt.vulkan_device_index;
            if (device_index < 0 || device_index >= get_gpu_count())
                device_index = get_default_gpu_index();

            d->vkdev = get_gpu_device(device_index);
        }
        if (!d->vkdev || !d->vkdev->is_valid()) opt.use_vulkan_compute = false; // no valid vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_uniform()) opt.use_fp16_uniform = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_packed()) opt.use_int8_packed = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_uniform()) opt.use_int8_uniform = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;
        if (!d->vkdev->info.support_subgroup_ops()) opt.use_subgroup_ops = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        if (opt.use_image_storage && !d->vkdev->info.support_fp16_image())
        {
            opt.use_fp16_storage = false;
            opt.use_fp16_uniform = false;
        }

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;

        // fp16 uniform makes no sense when fp16 arithmetic disabled
        if (!opt.use_fp16_arithmetic) opt.use_fp16_uniform = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i = 0; i < layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_overwrite_builtin_layer(typeindex);
#if NCNN_VULKAN
        if (!layer && opt.use_vulkan_compute && d->vkdev)
        {
            layer = create_layer_vulkan(typeindex);
        }
#endif // NCNN_VULKAN
        if (!layer)
        {
            layer = create_layer_cpu(typeindex);
        }
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        //         layer->type = std::string(layer_type);
        //         layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = d->blobs[top_blob_index];

            //             blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        int layer_support_vulkan = layer->support_vulkan;

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param_bin %d failed", i);
            continue;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        // pull out layer specific feature disabled set
        layer->featmask = pd.get(31, 0);

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d failed", i);
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        Option opt1 = get_masked_option(opt, layer->featmask);
#if NCNN_VULKAN
        if (opt1.use_vulkan_compute)
        {
            if (!layer->support_image_storage) opt1.use_image_storage = false;
        }
#endif // NCNN_VULKAN

        if (layer_support_vulkan && (!layer->support_vulkan || !opt1.use_vulkan_compute))
        {
            // vulkan layer cannot handle these param, recreate cpu layer
            Layer* layer_cpu = create_overwrite_builtin_layer(typeindex);
            if (!layer_cpu)
            {
                layer_cpu = create_layer_cpu(typeindex);
            }
            if (!layer_cpu)
            {
                int custom_index = typeindex & ~LayerType::CustomBit;
                layer_cpu = create_custom_layer(custom_index);
            }
            if (!layer_cpu)
            {
                NCNN_LOGE("layer %d not exists or registered", typeindex);
                clear();
                return -1;
            }

            layer_cpu->bottoms = layer->bottoms;
            layer_cpu->tops = layer->tops;
            layer_cpu->bottom_shapes = layer->bottom_shapes;
            layer_cpu->top_shapes = layer->top_shapes;
            layer_cpu->featmask = layer->featmask;

            int lr = layer_cpu->load_param(pd);
            if (lr != 0)
            {
                NCNN_LOGE("layer load_param %d failed", i);
                continue;
            }

            delete layer;
            layer = layer_cpu;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();

#undef READ_VALUE
    return 0;
}